

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::NeuralNetworkImageScaler::ByteSizeLong(NeuralNetworkImageScaler *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = 0;
  if (this->graybias_ != 0.0) {
    sVar1 = 6;
  }
  if (NAN(this->graybias_)) {
    sVar1 = 6;
  }
  sVar2 = sVar1;
  if (this->channelscale_ != 0.0) {
    sVar2 = sVar1 + 5;
  }
  if (NAN(this->channelscale_)) {
    sVar2 = sVar1 + 5;
  }
  sVar1 = sVar2;
  if (this->bluebias_ != 0.0) {
    sVar1 = sVar2 + 6;
  }
  if (NAN(this->bluebias_)) {
    sVar1 = sVar2 + 6;
  }
  sVar2 = sVar1;
  if (this->greenbias_ != 0.0) {
    sVar2 = sVar1 + 6;
  }
  if (NAN(this->greenbias_)) {
    sVar2 = sVar1 + 6;
  }
  sVar1 = sVar2;
  if (this->redbias_ != 0.0) {
    sVar1 = sVar2 + 6;
  }
  if (NAN(this->redbias_)) {
    sVar1 = sVar2 + 6;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t NeuralNetworkImageScaler::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkImageScaler)
  size_t total_size = 0;

  // float grayBias = 30;
  if (this->graybias() != 0) {
    total_size += 2 + 4;
  }

  // float channelScale = 10;
  if (this->channelscale() != 0) {
    total_size += 1 + 4;
  }

  // float blueBias = 20;
  if (this->bluebias() != 0) {
    total_size += 2 + 4;
  }

  // float greenBias = 21;
  if (this->greenbias() != 0) {
    total_size += 2 + 4;
  }

  // float redBias = 22;
  if (this->redbias() != 0) {
    total_size += 2 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}